

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::ProgramBinaryPersistenceCase::verify
          (ProgramBinaryPersistenceCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  bool bVar1;
  deUint32 program;
  int extraout_EAX;
  MessageBuilder *this_00;
  MessageBuilder local_1d8;
  undefined1 local_48 [8];
  ProgramBinary currentBinary;
  TestLog *log;
  ProgramBinary *binary_local;
  Program *program_local;
  ProgramBinaryPersistenceCase *this_local;
  
  currentBinary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)tcu::TestContext::getLog
                          ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx);
  Functional::anon_unknown_0::ProgramBinary::ProgramBinary((ProgramBinary *)local_48);
  program = glu::Program::getProgram((Program *)ctx);
  ProgramBinaryCase::getProgramBinary
            (&this->super_ProgramBinaryCase,(ProgramBinary *)local_48,program);
  bVar1 = Functional::anon_unknown_0::programBinariesEqual
                    ((ProgramBinary *)sig,(ProgramBinary *)local_48);
  if (!bVar1) {
    tcu::TestLog::operator<<
              (&local_1d8,
               (TestLog *)
               currentBinary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,
               (BeginMessageToken *)&tcu::TestLog::Message);
    this_00 = tcu::MessageBuilder::operator<<
                        (&local_1d8,
                         (char (*) [72])
                         "Fail, program binary may only change as a result of linking or loading.");
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d8);
    tcu::TestContext::setTestResult
              ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Program binary changed");
  }
  Functional::anon_unknown_0::ProgramBinary::~ProgramBinary((ProgramBinary *)local_48);
  return extraout_EAX;
}

Assistant:

void ProgramBinaryPersistenceCase::verify (glu::Program& program, const ProgramBinary& binary)
{
	TestLog&		log				= m_testCtx.getLog();
	ProgramBinary	currentBinary;

	getProgramBinary(currentBinary, program.getProgram());

	if (!programBinariesEqual(binary, currentBinary))
	{
		log << TestLog::Message << "Fail, program binary may only change as a result of linking or loading." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program binary changed");
	}
}